

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

void lys_precompile_augments_deviations_revert(ly_ctx *ctx,lys_module *mod)

{
  lyd_node *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong local_48;
  ulong local_40;
  lys_module *m;
  uint64_t count;
  uint64_t u;
  uint32_t i;
  lys_module *mod_local;
  ly_ctx *ctx_local;
  
  u._4_4_ = 0;
  do {
    if ((ctx->list).count <= u._4_4_) {
      return;
    }
    plVar1 = (ctx->list).field_2.dnodes[u._4_4_];
    if (plVar1[1].priv != (void *)0x0) {
      if (plVar1[1].priv == (void *)0x0) {
        local_40 = 0;
      }
      else {
        local_40 = *(ulong *)((long)plVar1[1].priv + -8);
      }
      for (count = 0; count < local_40; count = count + 1) {
        if (*(lys_module **)((long)plVar1[1].priv + count * 8) == mod) {
          if (count < local_40 - 1) {
            memmove((void *)((long)plVar1[1].priv + count * 8),
                    (void *)((long)plVar1[1].priv + count * 8 + 8),((local_40 - count) + -1) * 8);
          }
          *(long *)((long)plVar1[1].priv + -8) = *(long *)((long)plVar1[1].priv + -8) + -1;
          break;
        }
      }
      if ((plVar1[1].priv == (void *)0x0) || (*(long *)((long)plVar1[1].priv + -8) == 0)) {
        if (plVar1[1].priv != (void *)0x0) {
          free((void *)((long)plVar1[1].priv + -8));
        }
        plVar1[1].priv = (void *)0x0;
      }
    }
    lVar2._0_4_ = plVar1[2].hash;
    lVar2._4_4_ = plVar1[2].flags;
    if (lVar2 != 0) {
      lVar3._0_4_ = plVar1[2].hash;
      lVar3._4_4_ = plVar1[2].flags;
      if (lVar3 == 0) {
        local_48 = 0;
      }
      else {
        local_48 = *(ulong *)(*(long *)(plVar1 + 2) + -8);
      }
      for (count = 0; count < local_48; count = count + 1) {
        if (*(lys_module **)(*(long *)(plVar1 + 2) + count * 8) == mod) {
          if (count < local_48 - 1) {
            memmove((void *)(*(long *)(plVar1 + 2) + count * 8),
                    (void *)(*(long *)(plVar1 + 2) + count * 8 + 8),((local_48 - count) + -1) * 8);
          }
          *(long *)(*(long *)(plVar1 + 2) + -8) = *(long *)(*(long *)(plVar1 + 2) + -8) + -1;
          break;
        }
      }
      lVar4._0_4_ = plVar1[2].hash;
      lVar4._4_4_ = plVar1[2].flags;
      if ((lVar4 == 0) || (*(long *)(*(long *)(plVar1 + 2) + -8) == 0)) {
        lVar5._0_4_ = plVar1[2].hash;
        lVar5._4_4_ = plVar1[2].flags;
        if (lVar5 != 0) {
          free((void *)(*(long *)(plVar1 + 2) + -8));
        }
        plVar1[2].hash = 0;
        plVar1[2].flags = 0;
      }
    }
    u._4_4_ = u._4_4_ + 1;
  } while( true );
}

Assistant:

void
lys_precompile_augments_deviations_revert(struct ly_ctx *ctx, const struct lys_module *mod)
{
    uint32_t i;
    LY_ARRAY_COUNT_TYPE u, count;
    struct lys_module *m;

    for (i = 0; i < ctx->list.count; ++i) {
        m = ctx->list.objs[i];

        if (m->augmented_by) {
            count = LY_ARRAY_COUNT(m->augmented_by);
            for (u = 0; u < count; ++u) {
                if (m->augmented_by[u] == mod) {
                    /* keep the order */
                    if (u < count - 1) {
                        memmove(m->augmented_by + u, m->augmented_by + u + 1, (count - u - 1) * sizeof *m->augmented_by);
                    }
                    LY_ARRAY_DECREMENT(m->augmented_by);
                    break;
                }
            }
            if (!LY_ARRAY_COUNT(m->augmented_by)) {
                LY_ARRAY_FREE(m->augmented_by);
                m->augmented_by = NULL;
            }
        }

        if (m->deviated_by) {
            count = LY_ARRAY_COUNT(m->deviated_by);
            for (u = 0; u < count; ++u) {
                if (m->deviated_by[u] == mod) {
                    /* keep the order */
                    if (u < count - 1) {
                        memmove(m->deviated_by + u, m->deviated_by + u + 1, (count - u - 1) * sizeof *m->deviated_by);
                    }
                    LY_ARRAY_DECREMENT(m->deviated_by);
                    break;
                }
            }
            if (!LY_ARRAY_COUNT(m->deviated_by)) {
                LY_ARRAY_FREE(m->deviated_by);
                m->deviated_by = NULL;
            }
        }
    }
}